

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::RandomNormalLikeLayerParams::RandomNormalLikeLayerParams
          (RandomNormalLikeLayerParams *this,RandomNormalLikeLayerParams *from)

{
  void *pvVar1;
  float fVar2;
  float fVar3;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__RandomNormalLikeLayerParams_00399800;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  fVar2 = from->mean_;
  fVar3 = from->stddev_;
  this->seed_ = from->seed_;
  this->mean_ = fVar2;
  this->stddev_ = fVar3;
  return;
}

Assistant:

RandomNormalLikeLayerParams::RandomNormalLikeLayerParams(const RandomNormalLikeLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::memcpy(&seed_, &from.seed_,
    reinterpret_cast<char*>(&stddev_) -
    reinterpret_cast<char*>(&seed_) + sizeof(stddev_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.RandomNormalLikeLayerParams)
}